

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.cpp
# Opt level: O0

void __thiscall Compare::Compare(Compare *this,string *fileName)

{
  string local_38 [32];
  string *local_18;
  string *fileName_local;
  Compare *this_local;
  
  local_18 = fileName;
  fileName_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)fileName);
  GraphGenerator::GraphGenerator(&this->super_GraphGenerator,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_GraphGenerator)._vptr_GraphGenerator = (_func_int **)&PTR_output_00157410;
  std::vector<double,_std::allocator<double>_>::vector(&this->timeBase);
  std::vector<double,_std::allocator<double>_>::vector(&this->timeSimple);
  std::vector<double,_std::allocator<double>_>::vector(&this->timeRDS);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->countBase);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->countSimple);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->countRDS);
  return;
}

Assistant:

Compare::Compare(string fileName): GraphGenerator(fileName) { }